

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

bool __thiscall
Qentem::Value<wchar_t>::GroupBy
          (Value<wchar_t> *this,Value<wchar_t> *groupedValue,wchar_t *key,SizeT length)

{
  ValueType VVar1;
  bool bVar2;
  Value<wchar_t> *this_00;
  HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *obj;
  Value<wchar_t> *pVVar3;
  RealFormatInfo local_90;
  HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *local_88;
  VItem *obj_end;
  VItem *obj_item;
  Value<wchar_t> *pVStack_70;
  SizeT count;
  Value<wchar_t> *end;
  SizeT grouped_key_index;
  SizeT str_len;
  wchar_t *str;
  Value<wchar_t> *item_;
  ObjectT new_sub_obj;
  StringStream<wchar_t> stream;
  ValueType type;
  SizeT length_local;
  wchar_t *key_local;
  Value<wchar_t> *groupedValue_local;
  Value<wchar_t> *this_local;
  
  VVar1 = Type(this);
  if (VVar1 == Array) {
    StringStream<wchar_t>::StringStream
              ((StringStream<wchar_t> *)
               &new_sub_obj.
                super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                .index_);
    HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::HArray
              ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&item_);
    str = (wchar_t *)Array<Qentem::Value<wchar_t>_>::First((Array<Qentem::Value<wchar_t>_> *)this);
    _grouped_key_index = (wchar_t *)0x0;
    end._4_4_ = 0;
    reset(groupedValue);
    setTypeToObject(groupedValue);
    if (((str == (wchar_t *)0x0) || (bVar2 = isObject((Value<wchar_t> *)str), !bVar2)) ||
       (bVar2 = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                ::GetKeyIndex((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                               *)str,(SizeT *)&end,key,length), !bVar2)) {
      bVar2 = false;
    }
    else {
      pVStack_70 = Array<Qentem::Value<wchar_t>_>::End((Array<Qentem::Value<wchar_t>_> *)this);
      for (; (Value<wchar_t> *)str != pVStack_70; str = str + 6) {
        if ((str == (wchar_t *)0x0) || (bVar2 = isObject((Value<wchar_t> *)str), !bVar2)) {
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_001221ff;
        }
        obj_item._4_4_ = 0;
        obj_end = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                  ::First((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                           *)str);
        local_88 = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                   ::End((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                          *)str);
        for (; obj_end != local_88; obj_end = obj_end + 1) {
          if ((obj_end == (VItem *)0x0) || (bVar2 = isUndefined(&obj_end->Value), bVar2)) {
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_001221ff;
          }
          if (obj_item._4_4_ == (int)end) {
            bVar2 = SetCharAndLength<unsigned_int>
                              (&obj_end->Value,(wchar_t **)&grouped_key_index,
                               (uint *)((long)&end + 4));
            if (!bVar2) {
              StringStream<wchar_t>::Clear
                        ((StringStream<wchar_t> *)
                         &new_sub_obj.
                          super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                          .index_);
              pVVar3 = &obj_end->Value;
              Digit::RealFormatInfo::RealFormatInfo(&local_90,0xf);
              bVar2 = CopyValueTo<Qentem::StringStream<wchar_t>,void(Qentem::StringStream<wchar_t>,wchar_t_const*,unsigned_int)>
                                (pVVar3,(StringStream<wchar_t> *)
                                        &new_sub_obj.
                                         super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                                         .index_,local_90,
                                 (_func_void_StringStream<wchar_t>_wchar_t_ptr_uint *)0x0);
              if (!bVar2) {
                this_local._7_1_ = 0;
                bVar2 = true;
                goto LAB_001221ff;
              }
              _grouped_key_index =
                   StringStream<wchar_t>::First
                             ((StringStream<wchar_t> *)
                              &new_sub_obj.
                               super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                               .index_);
              end._4_4_ = StringStream<wchar_t>::Length
                                    ((StringStream<wchar_t> *)
                                     &new_sub_obj.
                                      super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                                      .index_);
            }
          }
          else {
            pVVar3 = &obj_end->Value;
            this_00 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator[]
                                ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&item_,
                                 &obj_end->Key);
            operator=(this_00,pVVar3);
          }
          obj_item._4_4_ = obj_item._4_4_ + 1;
        }
        obj = Memory::Move<Qentem::HArray<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>>
                        ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&item_);
        pVVar3 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                           ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)groupedValue
                            ,_grouped_key_index,end._4_4_);
        operator+=(pVVar3,obj);
      }
      this_local._7_1_ = 1;
      bVar2 = true;
    }
LAB_001221ff:
    HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::~HArray
              ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&item_);
    StringStream<wchar_t>::~StringStream
              ((StringStream<wchar_t> *)
               &new_sub_obj.
                super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                .index_);
    if (bVar2) goto LAB_0012224e;
  }
  else if (VVar1 == ValuePtr) {
    this_local._7_1_ = GroupBy((this->field_0).array_.storage_,groupedValue,key,length);
    goto LAB_0012224e;
  }
  this_local._7_1_ = 0;
LAB_0012224e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GroupBy(Value &groupedValue, const Char_T *key, const SizeT length) const {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            StringStream<Char_T> stream;
            ObjectT              new_sub_obj;
            const Value         *item_   = array_.First();
            const Char_T        *str     = nullptr;
            SizeT                str_len = 0;
            SizeT                grouped_key_index;

            groupedValue.reset();
            groupedValue.setTypeToObject();

            if ((item_ != nullptr) && item_->isObject() && item_->object_.GetKeyIndex(grouped_key_index, key, length)) {
                const Value *end = array_.End();

                while (item_ != end) {
                    if ((item_ != nullptr) && item_->isObject()) {
                        SizeT count = 0;

                        const VItem *obj_item = item_->object_.First();
                        const VItem *obj_end  = item_->object_.End();

                        while (obj_item != obj_end) {
                            if ((obj_item != nullptr) && !(obj_item->Value.isUndefined())) {
                                if (count != grouped_key_index) {
                                    new_sub_obj[obj_item->Key] = obj_item->Value;
                                } else if (!(obj_item->Value.SetCharAndLength(str, str_len))) {
                                    stream.Clear();

                                    if (obj_item->Value.CopyValueTo(stream)) {
                                        str     = stream.First();
                                        str_len = stream.Length();
                                    } else {
                                        return false;
                                    }
                                }

                                ++count;
                                ++obj_item;
                                continue;
                            }

                            return false;
                        }

                        groupedValue.object_.Get(str, str_len) += Memory::Move(new_sub_obj);

                        ++item_;
                        continue;
                    }

                    return false;
                }

                return true;
            }
        } else if (type == ValueType::ValuePtr) {
            return value_->GroupBy(groupedValue, key, length);
        }

        return false;
    }